

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_decompress.c
# Opt level: O1

size_t FSE_buildDTable(FSE_DTable *dt,short *normalizedCounter,uint maxSymbolValue,uint tableLog)

{
  short sVar1;
  size_t sVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  ushort uVar7;
  ulong uVar8;
  uint uVar9;
  undefined2 uVar10;
  int iVar11;
  ulong uVar12;
  ushort auStack_228 [256];
  
  bVar3 = (byte)tableLog;
  uVar9 = 1 << (bVar3 & 0x1f);
  sVar2 = 0xffffffffffffffd2;
  if ((maxSymbolValue < 0x100) && (sVar2 = 0xffffffffffffffd4, tableLog < 0xd)) {
    uVar5 = maxSymbolValue + 1;
    uVar10 = 1;
    uVar12 = 0;
    uVar8 = (ulong)(uVar9 - 1);
    do {
      uVar7 = normalizedCounter[uVar12];
      if ((short)uVar7 == -1) {
        *(char *)((long)dt + uVar8 * 4 + 6) = (char)uVar12;
        uVar7 = 1;
        uVar8 = (ulong)((int)uVar8 - 1);
      }
      else if ((0x10000 << (bVar3 - 1 & 0x1f)) >> 0x10 <= (int)(short)uVar7) {
        uVar10 = 0;
      }
      auStack_228[uVar12] = uVar7;
      uVar12 = uVar12 + 1;
    } while (uVar5 != uVar12);
    *(short *)dt = (short)tableLog;
    *(undefined2 *)((long)dt + 2) = uVar10;
    uVar12 = 0;
    uVar6 = 0;
    do {
      sVar1 = normalizedCounter[uVar12];
      if (0 < sVar1) {
        iVar11 = 0;
        do {
          *(char *)((long)dt + (ulong)uVar6 * 4 + 6) = (char)uVar12;
          do {
            uVar6 = uVar6 + (uVar9 >> 3) + (uVar9 >> 1) + 3 & uVar9 - 1;
          } while ((uint)uVar8 < uVar6);
          iVar11 = iVar11 + 1;
        } while (iVar11 != sVar1);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar5 + (uVar5 == 0));
    sVar2 = 0xffffffffffffffff;
    if (uVar6 == 0) {
      sVar2 = 0;
      uVar8 = 0;
      do {
        bVar4 = *(byte *)((long)dt + uVar8 * 4 + 6);
        uVar7 = auStack_228[bVar4];
        auStack_228[bVar4] = uVar7 + 1;
        iVar11 = 0x1f;
        if (uVar7 != 0) {
          for (; uVar7 >> iVar11 == 0; iVar11 = iVar11 + -1) {
          }
        }
        bVar4 = bVar3 - (char)iVar11;
        *(byte *)((long)dt + uVar8 * 4 + 7) = bVar4;
        *(ushort *)(dt + uVar8 + 1) = (uVar7 << (bVar4 & 0x1f)) - (short)uVar9;
        uVar8 = uVar8 + 1;
      } while (uVar9 != uVar8);
    }
  }
  return sVar2;
}

Assistant:

size_t FSE_buildDTable(FSE_DTable* dt, const short* normalizedCounter, unsigned maxSymbolValue, unsigned tableLog)
{
    void* const tdPtr = dt+1;   /* because *dt is unsigned, 32-bits aligned on 32-bits */
    FSE_DECODE_TYPE* const tableDecode = (FSE_DECODE_TYPE*) (tdPtr);
    U16 symbolNext[FSE_MAX_SYMBOL_VALUE+1];

    U32 const maxSV1 = maxSymbolValue + 1;
    U32 const tableSize = 1 << tableLog;
    U32 highThreshold = tableSize-1;

    /* Sanity Checks */
    if (maxSymbolValue > FSE_MAX_SYMBOL_VALUE) return ERROR(maxSymbolValue_tooLarge);
    if (tableLog > FSE_MAX_TABLELOG) return ERROR(tableLog_tooLarge);

    /* Init, lay down lowprob symbols */
    {   FSE_DTableHeader DTableH;
        DTableH.tableLog = (U16)tableLog;
        DTableH.fastMode = 1;
        {   S16 const largeLimit= (S16)(1 << (tableLog-1));
            U32 s;
            for (s=0; s<maxSV1; s++) {
                if (normalizedCounter[s]==-1) {
                    tableDecode[highThreshold--].symbol = (FSE_FUNCTION_TYPE)s;
                    symbolNext[s] = 1;
                } else {
                    if (normalizedCounter[s] >= largeLimit) DTableH.fastMode=0;
                    symbolNext[s] = normalizedCounter[s];
        }   }   }
        memcpy(dt, &DTableH, sizeof(DTableH));
    }

    /* Spread symbols */
    {   U32 const tableMask = tableSize-1;
        U32 const step = FSE_TABLESTEP(tableSize);
        U32 s, position = 0;
        for (s=0; s<maxSV1; s++) {
            int i;
            for (i=0; i<normalizedCounter[s]; i++) {
                tableDecode[position].symbol = (FSE_FUNCTION_TYPE)s;
                position = (position + step) & tableMask;
                while (position > highThreshold) position = (position + step) & tableMask;   /* lowprob area */
        }   }
        if (position!=0) return ERROR(GENERIC);   /* position must reach all cells once, otherwise normalizedCounter is incorrect */
    }

    /* Build Decoding table */
    {   U32 u;
        for (u=0; u<tableSize; u++) {
            FSE_FUNCTION_TYPE const symbol = (FSE_FUNCTION_TYPE)(tableDecode[u].symbol);
            U32 const nextState = symbolNext[symbol]++;
            tableDecode[u].nbBits = (BYTE) (tableLog - BIT_highbit32(nextState) );
            tableDecode[u].newState = (U16) ( (nextState << tableDecode[u].nbBits) - tableSize);
    }   }

    return 0;
}